

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall
HighsSymmetryDetection::isFromBinaryColumn(HighsSymmetryDetection *this,HighsInt pos)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int in_ESI;
  long *in_RDI;
  HighsInt col;
  
  if (in_ESI < (int)in_RDI[0x56]) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd),(long)in_ESI);
    iVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)iVar1);
    if ((*pvVar3 == 0.0) && (!NAN(*pvVar3))) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)iVar1);
      if ((*pvVar3 == 1.0) &&
         ((!NAN(*pvVar3) &&
          (pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                               (*in_RDI + 0x178),(long)iVar1), *pvVar4 != kContinuous)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HighsSymmetryDetection::isFromBinaryColumn(HighsInt pos) const {
  if (pos >= numActiveCols) return false;

  HighsInt col = currentPartition[pos];

  if (model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0 ||
      model->integrality_[col] == HighsVarType::kContinuous)
    return false;

  return true;
}